

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O3

void do_affects(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  short sVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  uint __len;
  long *plVar6;
  char *__format;
  AFFECT_DATA *pAVar7;
  AFFECT_DATA *pAVar8;
  char *pcVar9;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  string __str_1;
  string __str;
  string buffer;
  char buf [4608];
  long *local_1508;
  undefined8 uStack_1500;
  long local_14f8 [2];
  long *local_14e8;
  undefined8 uStack_14e0;
  long local_14d8 [2];
  long *local_14c8;
  char *local_14c0;
  long local_14b8 [2];
  _func_int **local_14a8;
  CHAR_DATA *local_14a0;
  long *local_1498;
  undefined8 uStack_1490;
  char *local_1488;
  long *local_1478;
  undefined8 uStack_1470;
  char *local_1468;
  buffer<char> local_1450;
  char local_1430 [504];
  char local_1238 [4616];
  
  pAVar7 = ch->affected;
  if ((pAVar7 == (AFFECT_DATA *)0x0) ||
     ((pAVar7->aftype == 5 && (pAVar7->next == (AFFECT_DATA *)0x0)))) {
    send_to_char("You are not affected by anything.\n\r",ch);
    return;
  }
  send_to_char("You are affected by:\n\r",ch);
  pAVar7 = ch->affected;
  if (pAVar7 != (AFFECT_DATA *)0x0) {
    local_14a8 = (_func_int **)&PTR_grow_0044b3a0;
    pAVar8 = (AFFECT_DATA *)0x0;
    local_14a0 = ch;
    do {
      if (pAVar7->aftype != 5) {
        memset(local_1238,0,0x1200);
        if ((pAVar8 == (AFFECT_DATA *)0x0) || (pAVar7->type != pAVar8->type)) {
LAB_002491ec:
          switch(pAVar7->aftype) {
          case 1:
            pcVar9 = pAVar7->name;
            if (pcVar9 == (char *)0x0) {
              pcVar9 = skill_table[pAVar7->type].name;
            }
            __format = "Skill  : %-17s";
            break;
          case 2:
            pcVar9 = pAVar7->name;
            if (pcVar9 == (char *)0x0) {
              pcVar9 = skill_table[pAVar7->type].name;
            }
            __format = "Power  : %-17s";
            break;
          case 3:
            pcVar9 = pAVar7->name;
            if (pcVar9 == (char *)0x0) {
              pcVar9 = skill_table[pAVar7->type].name;
            }
            __format = "Malady : %-17s";
            break;
          case 4:
            pcVar9 = pAVar7->name;
            if (pcVar9 == (char *)0x0) {
              pcVar9 = skill_table[pAVar7->type].name;
            }
            __format = "Commune: %-17s";
            break;
          case 5:
            goto switchD_00249209_caseD_5;
          case 6:
            pcVar9 = pAVar7->name;
            if (pcVar9 == (char *)0x0) {
              pcVar9 = skill_table[pAVar7->type].name;
            }
            __format = "Rune   : %-17s";
            break;
          case 7:
            pcVar9 = pAVar7->name;
            if (pcVar9 == (char *)0x0) {
              pcVar9 = skill_table[pAVar7->type].name;
            }
            __format = "Timer  : %-17s";
            break;
          default:
            pcVar9 = pAVar7->name;
            if (pcVar9 == (char *)0x0) {
              pcVar9 = skill_table[pAVar7->type].name;
            }
            __format = "Spell  : %-17s";
          }
          sprintf(local_1238,__format,pcVar9);
        }
        else {
          if ((pAVar7->name != (char *)0x0 || pAVar8->name != (char *)0x0) &&
             (bVar4 = str_cmp(pAVar7->name,pAVar8->name), bVar4)) goto LAB_002491ec;
          if (ch->level < 0x14) goto LAB_0024975d;
          builtin_strncpy(local_1238 + 0x10,"          ",0xb);
          builtin_strncpy(local_1238,"                ",0x10);
        }
switchD_00249209_caseD_5:
        send_to_char(local_1238,ch);
        if (0x13 < ch->level) {
          sVar2 = pAVar7->duration;
          if ((long)pAVar7->mod_name < 0) {
            plVar6 = (long *)affect_loc_name(0);
            if (-1 < pAVar7->mod_name) goto LAB_002493da;
            uVar5 = (uint)pAVar7->modifier;
            uVar3 = -uVar5;
            if (0 < (int)uVar5) {
              uVar3 = uVar5;
            }
            __len = 1;
            if (((9 < uVar3) && (__len = 2, 99 < uVar3)) && (__len = 3, 999 < uVar3)) {
              __len = 5 - (uVar3 < 10000);
            }
            local_1508 = local_14f8;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_1508,(char)__len - (char)(pAVar7->modifier >> 7));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(uVar5 >> 0x1f) + (long)local_1508),__len,uVar3);
            pcVar9 = " by ";
          }
          else {
            plVar6 = (long *)mod_names[pAVar7->mod_name].name;
LAB_002493da:
            local_1508 = local_14f8;
            pcVar9 = "";
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1508,"","");
          }
          local_1478 = local_1508;
          uStack_1470 = uStack_1500;
          local_1450.size_ = 0;
          local_1450._vptr_buffer = local_14a8;
          local_1450.capacity_ = 500;
          fmt.size_ = 0x12;
          fmt.data_ = "| modifies {}{}{} ";
          args.field_1.values_ =
               (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_1498;
          args.desc_ = 0xdcc;
          local_1498 = plVar6;
          local_1488 = pcVar9;
          local_1450.ptr_ = local_1430;
          ::fmt::v9::detail::vformat_to<char>(&local_1450,fmt,args,(locale_ref)0x0);
          local_14c8 = local_14b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_14c8,local_1450.ptr_,local_1450.ptr_ + local_1450.size_);
          ch = local_14a0;
          if (local_1450.ptr_ != local_1430) {
            operator_delete(local_1450.ptr_,local_1450.capacity_);
          }
          if (local_1508 != local_14f8) {
            operator_delete(local_1508,local_14f8[0] + 1);
          }
          if (pAVar7->aftype != 5) {
            send_to_char((char *)local_14c8,ch);
          }
          if (pAVar7->duration == -1) {
            std::__cxx11::string::_M_replace((ulong)&local_14c8,0,local_14c0,0x37fb1e);
          }
          else {
            iVar1 = (int)sVar2 + 1;
            if (sVar2 == 0) {
              local_14e8 = local_14d8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_14e8,"","");
              local_1488 = "";
            }
            else {
              uVar5 = iVar1 / 2;
              uVar3 = -uVar5;
              if (0 < (int)uVar5) {
                uVar3 = uVar5;
              }
              uVar5 = 1;
              if (((9 < uVar3) && (uVar5 = 2, 99 < uVar3)) && (uVar5 = 3, 999 < uVar3)) {
                uVar5 = 5 - (uVar3 < 10000);
              }
              local_14e8 = local_14d8;
              std::__cxx11::string::_M_construct((ulong)&local_14e8,(sVar2 < -2) + (char)uVar5);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)((long)local_14e8 + (ulong)(sVar2 < -2)),uVar5,uVar3);
              local_1488 = " and";
            }
            bVar4 = ((int)sVar2 & 1U) != 0;
            if (bVar4) {
              local_1488 = "";
            }
            local_1478 = (long *)0x39ed74;
            if (!bVar4) {
              local_1478 = (long *)0x37fb41;
            }
            local_1468 = "s";
            if (iVar1 == 2) {
              local_1468 = "";
            }
            if (sVar2 == 0) {
              local_1468 = "";
            }
            local_1498 = local_14e8;
            uStack_1490 = uStack_14e0;
            local_1450.size_ = 0;
            local_1450._vptr_buffer = local_14a8;
            local_1450.capacity_ = 500;
            fmt_00.size_ = 0x11;
            fmt_00.data_ = "for%s%s%s hour%s.";
            args_00.field_1.values_ =
                 (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_1498;
            args_00.desc_ = 0xcccd;
            local_1450.ptr_ = local_1430;
            ::fmt::v9::detail::vformat_to<char>(&local_1450,fmt_00,args_00,(locale_ref)0x0);
            local_1508 = local_14f8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1508,local_1450.ptr_,local_1450.ptr_ + local_1450.size_);
            if (local_1450.ptr_ != local_1430) {
              operator_delete(local_1450.ptr_,local_1450.capacity_);
            }
            std::__cxx11::string::operator=((string *)&local_14c8,(string *)&local_1508);
            if (local_1508 != local_14f8) {
              operator_delete(local_1508,local_14f8[0] + 1);
            }
            if (local_14e8 != local_14d8) {
              operator_delete(local_14e8,local_14d8[0] + 1);
            }
          }
          if (pAVar7->aftype != 5) {
            send_to_char((char *)local_14c8,ch);
          }
          if (local_14c8 != local_14b8) {
            operator_delete(local_14c8,local_14b8[0] + 1);
          }
        }
        pAVar8 = pAVar7;
        if (pAVar7->aftype != 5) {
          send_to_char("\n\r",ch);
        }
      }
LAB_0024975d:
      pAVar7 = pAVar7->next;
    } while (pAVar7 != (AFFECT_DATA *)0x0);
  }
  return;
}

Assistant:

void do_affects(CHAR_DATA *ch, char *argument)
{
	if (ch->affected == nullptr || !(ch->affected->aftype != AFT_INVIS || ch->affected->next != nullptr))
	{
		send_to_char("You are not affected by anything.\n\r", ch);
		return;
	}

	send_to_char("You are affected by:\n\r", ch);

	AFFECT_DATA *paf_last = nullptr;
	char buf[MAX_STRING_LENGTH];
	for (auto paf = ch->affected; paf != nullptr; paf = paf->next)
	{
		if (paf->aftype == AFT_INVIS)
			continue;

		for (auto i = 0; i < MAX_STRING_LENGTH; i++)
		{
			buf[i] = '\0';
		}

		if (paf_last != nullptr
			&& (paf->type == paf_last->type && ((paf->name == nullptr && paf_last->name == nullptr) || !str_cmp(paf->name, paf_last->name))))
		{
			if (ch->level >= 20)
				sprintf(buf, "                          ");
			else
				continue;
		}
		else
		{
			if (paf->aftype == AFT_SKILL)
				sprintf(buf, "Skill  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_POWER)
				sprintf(buf, "Power  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_MALADY)
				sprintf(buf, "Malady : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_COMMUNE)
				sprintf(buf, "Commune: %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_RUNE)
				sprintf(buf, "Rune   : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_TIMER)
				sprintf(buf, "Timer  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype != AFT_INVIS)
				sprintf(buf, "Spell  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
		}

		send_to_char(buf, ch);

		if (ch->level >= 20)
		{
			auto showdur = paf->duration + 1;

			auto buffer = fmt::format("| modifies {}{}{} ",
					(paf->mod_name > -1) ? mod_names[paf->mod_name].name : affect_loc_name(paf->location),
					(paf->mod_name > -1) ? "" : " by ",
					(paf->mod_name > -1) ? "" : std::to_string(paf->modifier)); //TODO: change the rest of the sprintf calls to format

			if (paf->aftype != AFT_INVIS)
				send_to_char(buffer.c_str(), ch);

			if (paf->duration == -1)
			{
				buffer = "permanently";
			}
			else
			{
				buffer = fmt::format("for%s%s%s hour%s.",
					(showdur == 1) ? "" : std::to_string(showdur / 2),
					(showdur % 2 == 0) ? "" : (showdur == 1) ? "" : " and", (showdur % 2 == 0) ? "" : " a half",
					(showdur == 1 || showdur == 2) ? "" : "s");
			}

			if (paf->aftype != AFT_INVIS)
				send_to_char(buffer.c_str(), ch);
		}

		if (paf->aftype != AFT_INVIS)
			send_to_char("\n\r", ch);

		paf_last = paf;
	}
}